

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_loadCEntropy(ZSTD_compressedBlockState_t *bs,void *workspace,void *dict,size_t dictSize)

{
  uint uVar1;
  void *workSpace;
  FSE_repeat FVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  size_t sVar8;
  void *pvVar9;
  U32 *pUVar10;
  ulong uVar11;
  uint litlengthLog;
  uint litlengthMaxValue;
  void *local_f8;
  uint offcodeMaxValue;
  uint local_ec;
  uint maxSymbolValue;
  short offcodeNCount [32];
  
  offcodeMaxValue = 0x1f;
  offcodeNCount[0] = 1;
  offcodeNCount[1] = 0;
  (bs->entropy).huf.repeatMode = HUF_repeat_check;
  maxSymbolValue = 0xff;
  sVar3 = HUF_readCTable((HUF_CElt *)bs,&maxSymbolValue,(void *)((long)dict + 8),dictSize - 8,
                         (uint *)offcodeNCount);
  if (offcodeNCount._0_4_ == 0) {
    (bs->entropy).huf.repeatMode = HUF_repeat_valid;
  }
  sVar4 = 0;
  if (0xfe < maxSymbolValue && sVar3 < 0xffffffffffffff89) {
    sVar4 = sVar3;
  }
  sVar8 = 0xffffffffffffffe2;
  if (0xfe < maxSymbolValue && sVar3 < 0xffffffffffffff89) {
    uVar11 = dictSize + (long)dict;
    pvVar9 = (void *)((long)dict + 8 + sVar4);
    local_f8 = workspace;
    sVar3 = FSE_readNCount(offcodeNCount,&offcodeMaxValue,&maxSymbolValue,pvVar9,
                           uVar11 - (long)pvVar9);
    if (((sVar3 < 0xffffffffffffff89) && (maxSymbolValue < 9)) &&
       (sVar4 = FSE_buildCTable_wksp
                          ((bs->entropy).fse.offcodeCTable,offcodeNCount,0x1f,maxSymbolValue,
                           local_f8,0x2200), sVar4 < 0xffffffffffffff89)) {
      pvVar9 = (void *)((long)pvVar9 + sVar3);
      litlengthMaxValue = 0x34;
      sVar3 = FSE_readNCount((short *)&maxSymbolValue,&litlengthMaxValue,&litlengthLog,pvVar9,
                             uVar11 - (long)pvVar9);
      if ((sVar3 < 0xffffffffffffff89) && (litlengthLog < 10)) {
        local_ec = litlengthMaxValue;
        sVar4 = FSE_buildCTable_wksp
                          ((bs->entropy).fse.matchlengthCTable,(short *)&maxSymbolValue,
                           litlengthMaxValue,litlengthLog,local_f8,0x2200);
        if (sVar4 < 0xffffffffffffff89) {
          FVar2 = ZSTD_dictNCountRepeat((short *)&maxSymbolValue,local_ec,0x34);
          (bs->entropy).fse.matchlength_repeatMode = FVar2;
          pvVar9 = (void *)((long)pvVar9 + sVar3);
          litlengthMaxValue = 0x23;
          sVar3 = FSE_readNCount((short *)&maxSymbolValue,&litlengthMaxValue,&litlengthLog,pvVar9,
                                 uVar11 - (long)pvVar9);
          workSpace = local_f8;
          uVar1 = litlengthMaxValue;
          if (((sVar3 < 0xffffffffffffff89) && (litlengthLog < 10)) &&
             (local_f8 = (void *)sVar3,
             sVar3 = FSE_buildCTable_wksp
                               ((bs->entropy).fse.litlengthCTable,(short *)&maxSymbolValue,
                                litlengthMaxValue,litlengthLog,workSpace,0x2200),
             sVar3 < 0xffffffffffffff89)) {
            FVar2 = ZSTD_dictNCountRepeat((short *)&maxSymbolValue,uVar1,0x23);
            (bs->entropy).fse.litlength_repeatMode = FVar2;
            uVar7 = (long)pvVar9 + (long)local_f8 + 0xcU;
            if (uVar7 <= uVar11) {
              pUVar10 = (U32 *)((long)pvVar9 + (long)local_f8);
              bs->rep[0] = *pUVar10;
              bs->rep[1] = pUVar10[1];
              bs->rep[2] = pUVar10[2];
              uVar11 = uVar11 - uVar7;
              uVar6 = (int)uVar11 + 0x20000;
              uVar1 = 0x1f;
              if (uVar6 != 0) {
                for (; uVar6 >> uVar1 == 0; uVar1 = uVar1 - 1) {
                }
              }
              uVar6 = 0x1f;
              if (uVar11 >> 0x11 < 0x7fff) {
                uVar6 = uVar1;
              }
              FVar2 = ZSTD_dictNCountRepeat(offcodeNCount,offcodeMaxValue,uVar6);
              (bs->entropy).fse.offcode_repeatMode = FVar2;
              lVar5 = 0;
              while (lVar5 != 3) {
                pUVar10 = bs->rep + lVar5;
                if ((ulong)*pUVar10 == 0) {
                  return 0xffffffffffffffe2;
                }
                lVar5 = lVar5 + 1;
                if (uVar11 < *pUVar10) {
                  return 0xffffffffffffffe2;
                }
              }
              sVar8 = uVar7 - (long)dict;
            }
          }
        }
      }
    }
  }
  return sVar8;
}

Assistant:

size_t ZSTD_loadCEntropy(ZSTD_compressedBlockState_t* bs, void* workspace,
                         const void* const dict, size_t dictSize)
{
    short offcodeNCount[MaxOff+1];
    unsigned offcodeMaxValue = MaxOff;
    const BYTE* dictPtr = (const BYTE*)dict;    /* skip magic num and dict ID */
    const BYTE* const dictEnd = dictPtr + dictSize;
    dictPtr += 8;
    bs->entropy.huf.repeatMode = HUF_repeat_check;

    {   unsigned maxSymbolValue = 255;
        unsigned hasZeroWeights = 1;
        size_t const hufHeaderSize = HUF_readCTable((HUF_CElt*)bs->entropy.huf.CTable, &maxSymbolValue, dictPtr,
            dictEnd-dictPtr, &hasZeroWeights);

        /* We only set the loaded table as valid if it contains all non-zero
         * weights. Otherwise, we set it to check */
        if (!hasZeroWeights)
            bs->entropy.huf.repeatMode = HUF_repeat_valid;

        RETURN_ERROR_IF(HUF_isError(hufHeaderSize), dictionary_corrupted, "");
        RETURN_ERROR_IF(maxSymbolValue < 255, dictionary_corrupted, "");
        dictPtr += hufHeaderSize;
    }

    {   unsigned offcodeLog;
        size_t const offcodeHeaderSize = FSE_readNCount(offcodeNCount, &offcodeMaxValue, &offcodeLog, dictPtr, dictEnd-dictPtr);
        RETURN_ERROR_IF(FSE_isError(offcodeHeaderSize), dictionary_corrupted, "");
        RETURN_ERROR_IF(offcodeLog > OffFSELog, dictionary_corrupted, "");
        /* fill all offset symbols to avoid garbage at end of table */
        RETURN_ERROR_IF(FSE_isError(FSE_buildCTable_wksp(
                bs->entropy.fse.offcodeCTable,
                offcodeNCount, MaxOff, offcodeLog,
                workspace, HUF_WORKSPACE_SIZE)),
            dictionary_corrupted, "");
        /* Defer checking offcodeMaxValue because we need to know the size of the dictionary content */
        dictPtr += offcodeHeaderSize;
    }

    {   short matchlengthNCount[MaxML+1];
        unsigned matchlengthMaxValue = MaxML, matchlengthLog;
        size_t const matchlengthHeaderSize = FSE_readNCount(matchlengthNCount, &matchlengthMaxValue, &matchlengthLog, dictPtr, dictEnd-dictPtr);
        RETURN_ERROR_IF(FSE_isError(matchlengthHeaderSize), dictionary_corrupted, "");
        RETURN_ERROR_IF(matchlengthLog > MLFSELog, dictionary_corrupted, "");
        RETURN_ERROR_IF(FSE_isError(FSE_buildCTable_wksp(
                bs->entropy.fse.matchlengthCTable,
                matchlengthNCount, matchlengthMaxValue, matchlengthLog,
                workspace, HUF_WORKSPACE_SIZE)),
            dictionary_corrupted, "");
        bs->entropy.fse.matchlength_repeatMode = ZSTD_dictNCountRepeat(matchlengthNCount, matchlengthMaxValue, MaxML);
        dictPtr += matchlengthHeaderSize;
    }

    {   short litlengthNCount[MaxLL+1];
        unsigned litlengthMaxValue = MaxLL, litlengthLog;
        size_t const litlengthHeaderSize = FSE_readNCount(litlengthNCount, &litlengthMaxValue, &litlengthLog, dictPtr, dictEnd-dictPtr);
        RETURN_ERROR_IF(FSE_isError(litlengthHeaderSize), dictionary_corrupted, "");
        RETURN_ERROR_IF(litlengthLog > LLFSELog, dictionary_corrupted, "");
        RETURN_ERROR_IF(FSE_isError(FSE_buildCTable_wksp(
                bs->entropy.fse.litlengthCTable,
                litlengthNCount, litlengthMaxValue, litlengthLog,
                workspace, HUF_WORKSPACE_SIZE)),
            dictionary_corrupted, "");
        bs->entropy.fse.litlength_repeatMode = ZSTD_dictNCountRepeat(litlengthNCount, litlengthMaxValue, MaxLL);
        dictPtr += litlengthHeaderSize;
    }

    RETURN_ERROR_IF(dictPtr+12 > dictEnd, dictionary_corrupted, "");
    bs->rep[0] = MEM_readLE32(dictPtr+0);
    bs->rep[1] = MEM_readLE32(dictPtr+4);
    bs->rep[2] = MEM_readLE32(dictPtr+8);
    dictPtr += 12;

    {   size_t const dictContentSize = (size_t)(dictEnd - dictPtr);
        U32 offcodeMax = MaxOff;
        if (dictContentSize <= ((U32)-1) - 128 KB) {
            U32 const maxOffset = (U32)dictContentSize + 128 KB; /* The maximum offset that must be supported */
            offcodeMax = ZSTD_highbit32(maxOffset); /* Calculate minimum offset code required to represent maxOffset */
        }
        /* All offset values <= dictContentSize + 128 KB must be representable for a valid table */
        bs->entropy.fse.offcode_repeatMode = ZSTD_dictNCountRepeat(offcodeNCount, offcodeMaxValue, MIN(offcodeMax, MaxOff));

        /* All repCodes must be <= dictContentSize and != 0 */
        {   U32 u;
            for (u=0; u<3; u++) {
                RETURN_ERROR_IF(bs->rep[u] == 0, dictionary_corrupted, "");
                RETURN_ERROR_IF(bs->rep[u] > dictContentSize, dictionary_corrupted, "");
    }   }   }

    return dictPtr - (const BYTE*)dict;
}